

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::RunContext::UnfinishedSections::UnfinishedSections
          (UnfinishedSections *this,SectionInfo *_info,Counts *_prevAssertions)

{
  undefined8 *in_RDX;
  SectionInfo *in_RDI;
  SectionInfo *unaff_retaddr;
  
  SectionInfo::SectionInfo(unaff_retaddr,in_RDI);
  *(undefined8 *)(in_RDI + 1) = *in_RDX;
  *(undefined8 *)&in_RDI[1].field_0x8 = in_RDX[1];
  return;
}

Assistant:

UnfinishedSections( SectionInfo const& _info, Counts const& _prevAssertions )
            : info( _info ), prevAssertions( _prevAssertions )
            {}